

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

String * __thiscall
Corrade::Utility::
format<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,unsigned_long,char_const*,Corrade::Containers::String,Corrade::Containers::BasicStringView<char>>
          (String *__return_storage_ptr__,Utility *this,char *format,
          BasicStringView<const_char> *args,BasicStringView<const_char> *args_1,
          BasicStringView<const_char> *args_2,String *args_3,BasicStringView<const_char> *args_4,
          BasicStringView<const_char> *args_5,BasicStringView<const_char> *args_6,
          unsigned_long *args_7,char **args_8)

{
  char *data;
  size_t size_00;
  StringViewFlags local_98 [3];
  BasicStringView<char> local_80;
  undefined1 local_69;
  BasicStringView<char> local_68;
  size_t local_58;
  size_t size;
  String *args_local_3;
  BasicStringView<const_char> *args_local_2;
  BasicStringView<const_char> *args_local_1;
  BasicStringView<const_char> *args_local;
  char *format_local;
  String *string;
  
  size = (size_t)args_2;
  args_local_3 = (String *)args_1;
  args_local_2 = args;
  args_local_1 = (BasicStringView<const_char> *)format;
  args_local = (BasicStringView<const_char> *)this;
  format_local = (char *)__return_storage_ptr__;
  Containers::BasicStringView<char>::BasicStringView(&local_68);
  local_58 = formatInto<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,unsigned_long,char_const*>
                       (&local_68,(char *)args_local,args_local_1,args_local_2,
                        (BasicStringView<const_char> *)args_local_3,(String *)size,
                        (BasicStringView<const_char> *)args_3,args_4,args_5,(unsigned_long *)args_6,
                        (char **)args_7);
  local_69 = 0;
  Containers::String::String(__return_storage_ptr__,local_58);
  data = Containers::String::data(__return_storage_ptr__);
  size_00 = local_58 + 1;
  Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
            (local_98);
  Containers::BasicStringView<char>::BasicStringView(&local_80,data,size_00,local_98[0]);
  formatInto<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,unsigned_long,char_const*>
            (&local_80,(char *)args_local,args_local_1,args_local_2,
             (BasicStringView<const_char> *)args_local_3,(String *)size,
             (BasicStringView<const_char> *)args_3,args_4,args_5,(unsigned_long *)args_6,
             (char **)args_7);
  return __return_storage_ptr__;
}

Assistant:

String format(const char* format, const Args&... args) {
    /* Get just the size first. Can't pass just nullptr, because that would
       match the formatInto(std::FILE*) overload, can't pass a String because
       it's guaranteed to always point to a null-terminated char array, even if
       it's empty. */
    const std::size_t size = formatInto(MutableStringView{}, format, args...);
    String string{NoInit, size};
    /* The String is created with an extra byte for the null terminator, but
       since printf() always wants to print the null terminator, we need to
       pass a view *including* the null terminator to it -- which is why we
       have to create the view manually. Once we switch away from printf() this
       workaround can be removed. */
    formatInto(MutableStringView{string.data(), size + 1}, format, args...);
    return string;
}